

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

char * createReceiveTargetAddress(IOTHUB_MESSAGING_HANDLE messagingHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  size_t sVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t addressLen;
  char *AMQP_SEND_TARGET_ADDRESS_FMT;
  LOGGER_LOG l;
  char *buffer;
  char *result;
  IOTHUB_MESSAGING_HANDLE messagingHandle_local;
  
  if (messagingHandle->hostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"createReceiveTargetAddress",0x241,1,
                "createReceiveTargetAddress failed - hostname cannot be NULL");
    }
    buffer = (char *)0x0;
  }
  else {
    sVar3 = strlen("amqps://%s/messages/servicebound/feedback");
    sVar4 = strlen(messagingHandle->hostname);
    buffer = (char *)malloc(sVar3 + sVar4 + 1);
    if (buffer == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"createReceiveTargetAddress",0x24b,1,"Malloc failed for receiveTargetAddress");
      }
      buffer = (char *)0x0;
    }
    else {
      iVar1 = snprintf(buffer,sVar3 + sVar4 + 1,"amqps://%s/messages/servicebound/feedback",
                       messagingHandle->hostname);
      if (iVar1 < 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"createReceiveTargetAddress",0x250,1,
                    "sprintf_s failed for receiveTargetAddress.");
        }
        free(buffer);
        buffer = (char *)0x0;
      }
    }
  }
  return buffer;
}

Assistant:

static char* createReceiveTargetAddress(IOTHUB_MESSAGING_HANDLE messagingHandle)
{
    char* result;

    char* buffer = NULL;
    if (messagingHandle->hostname == NULL)
    {
        LogError("createReceiveTargetAddress failed - hostname cannot be NULL");
        result = NULL;
    }
    else
    {
        const char* AMQP_SEND_TARGET_ADDRESS_FMT = "amqps://%s/messages/servicebound/feedback";
        size_t addressLen = strlen(AMQP_SEND_TARGET_ADDRESS_FMT) + strlen(messagingHandle->hostname);

        if ((buffer = (char*)malloc(addressLen + 1)) == NULL)
        {
            LogError("Malloc failed for receiveTargetAddress");
            result = NULL;
        }
        else if ((snprintf(buffer, addressLen + 1, AMQP_SEND_TARGET_ADDRESS_FMT, messagingHandle->hostname)) < 0)
        {
            LogError("sprintf_s failed for receiveTargetAddress.");
            free((char*)buffer);
            result = NULL;
        }
        else
        {
            result = buffer;
        }
    }
    return result;
}